

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

void jinit_c_coef_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  jpeg_c_coef_controller *pjVar1;
  void *pvVar2;
  int local_2c;
  int i;
  JBLOCKROW buffer;
  my_coef_ptr_conflict1 coef;
  boolean need_full_buffer_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = (jpeg_c_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xc0);
  cinfo->coef = pjVar1;
  pjVar1->start_pass = start_pass_coef;
  if (need_full_buffer == 0) {
    pvVar2 = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
    for (local_2c = 0; local_2c < 10; local_2c = local_2c + 1) {
      (&pjVar1[2].start_pass)[local_2c] =
           (_func_void_j_compress_ptr_J_BUF_MODE *)((long)pvVar2 + (long)local_2c * 0x80);
    }
    pjVar1[7].start_pass = (_func_void_j_compress_ptr_J_BUF_MODE *)0x0;
  }
  else {
    cinfo->err->msg_code = 3;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_coef_controller (j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_coef_controller));
  cinfo->coef = (struct jpeg_c_coef_controller *) coef;
  coef->pub.start_pass = start_pass_coef;

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef FULL_COEF_BUFFER_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    int ci;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, FALSE,
	 (JDIMENSION) jround_up((long) compptr->width_in_blocks,
				(long) compptr->h_samp_factor),
	 (JDIMENSION) jround_up((long) compptr->height_in_blocks,
				(long) compptr->v_samp_factor),
	 (JDIMENSION) compptr->v_samp_factor);
    }
#else
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  C_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK));
    for (i = 0; i < C_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    coef->whole_image[0] = NULL; /* flag for no virtual arrays */
  }
}